

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScParser.cpp
# Opt level: O3

bool __thiscall ScParser::parseFunctionCall(ScParser *this,char **data)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char *__s1;
  char *pcVar4;
  ScName target;
  ScTarget local_50;
  
  if (this->m_hasCurrentState != true) {
    return false;
  }
  pcVar4 = *data;
  lVar3 = 0x30;
  iVar2 = strncmp(pcVar4,"boost::statechart::detail::safe_reaction_result ",0x30);
  if (iVar2 != 0) {
    lVar3 = 0x2b;
    iVar2 = strncmp(pcVar4,"boost::statechart::detail::reaction_result ",0x2b);
    if (iVar2 != 0) goto LAB_00117df5;
  }
  pcVar4 = pcVar4 + lVar3;
  *data = pcVar4;
LAB_00117df5:
  iVar2 = strncmp(pcVar4,"boost::statechart::simple_state<",0x20);
  if (iVar2 != 0) {
    return false;
  }
  pcVar4 = pcVar4 + 0x21;
  iVar2 = 1;
  do {
    __s1 = pcVar4 + -1;
    *data = __s1;
    cVar1 = pcVar4[-1];
    if (cVar1 == '<') {
      iVar2 = iVar2 + 1;
    }
    else if (cVar1 == '>') {
      iVar2 = iVar2 + -1;
      if (iVar2 == 0) {
        if (pcVar4[-2] == ' ') {
          pcVar4[-2] = '\0';
          __s1 = *data + 1;
          *data = __s1;
        }
        else {
          *data = pcVar4;
          pcVar4[-1] = '\0';
          __s1 = *data;
        }
LAB_00117e72:
        iVar2 = strncmp(__s1,"::transit<",10);
        if (iVar2 == 0) {
          *data = __s1 + 10;
          matchTransitionTarget(&local_50,data);
          ScModel::addTransition
                    (this->m_model,&local_50.name,&this->m_currentEvent,local_50.historyMode);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50.name._M_dataplus._M_p != &local_50.name.field_2) {
            operator_delete(local_50.name._M_dataplus._M_p,
                            local_50.name.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar2 = strncmp(__s1,"::discard_event()",0x11);
          if (iVar2 != 0) {
            iVar2 = strncmp(__s1,"::defer_event()",0xf);
            if (iVar2 == 0) {
              *data = __s1 + 0xf;
              ScModel::addDeferral(this->m_model,&this->m_currentEvent);
              return true;
            }
            return true;
          }
          *data = __s1 + 0x11;
          ScModel::addTransition(this->m_model,&this->m_currentState,&this->m_currentEvent,None);
        }
        return true;
      }
    }
    else if (cVar1 == '\0') goto LAB_00117e72;
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

bool ScParser::parseFunctionCall(char *&data)
{
    if (!m_hasCurrentState) {
        return false;
    }

    // boost::statechart::detail::safe_reaction_result
    //     boost::statechart::simple_state<...>::transit<*state-name*>()

    if (!expectStartsWith(data, "boost::statechart::detail::safe_reaction_result ")) {
        expectStartsWith(data, "boost::statechart::detail::reaction_result ");
    }
    if (expectStartsWith(data, "boost::statechart::simple_state<")) {
        matchAngleArgument(data, true);
        if (expectStartsWith(data, "::transit<")) {
            auto [target, historyMode] = matchTransitionTarget(data);
            m_model.addTransition(target, m_currentEvent, historyMode);
        } else if (expectStartsWith(data, "::discard_event()")) {
            m_model.addTransition(m_currentState, m_currentEvent);
        } else if (expectStartsWith(data, "::defer_event()")) {
            m_model.addDeferral(m_currentEvent);
        }
        return true;
    }
    return false;
}